

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void last_wal_flush_header_test(void)

{
  fdb_doc **ppfVar1;
  fdb_status fVar2;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  long lVar3;
  char *__format;
  ulong uVar4;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_txn1;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile;
  fdb_file_handle *dbfile_txn2;
  fdb_doc **local_560;
  fdb_kvs_handle *db_txn2;
  fdb_kvs_config kvs_config;
  fdb_doc *local_538 [31];
  timeval __test_begin;
  fdb_config fconfig;
  char keybuf [256];
  char bodybuf [256];
  char metabuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.flags = 1;
  fconfig.purging_interval = 0;
  fconfig.compaction_threshold = '\0';
  fdb_open(&dbfile,"dummy1",&fconfig);
  fdb_open(&dbfile_txn1,"dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
  local_560 = local_538;
  for (uVar4 = 0; uVar4 != 0x1e; uVar4 = uVar4 + 1) {
    sprintf(keybuf,"key%d",uVar4 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar4 & 0xffffffff);
    sprintf(bodybuf,"body%d",uVar4 & 0xffffffff);
    keylen = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    ppfVar1 = local_560;
    fdb_doc_create(local_560,keybuf,keylen,metabuf,metalen,bodybuf,bodylen);
    local_560 = ppfVar1 + 1;
  }
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    fdb_set(db,local_538[lVar3]);
  }
  fdb_begin_transaction(dbfile_txn1,'\x02');
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    fdb_set(db_txn1,local_538[lVar3 + 2]);
  }
  fdb_commit(dbfile,'\x01');
  fdb_close(dbfile);
  fdb_close(dbfile_txn1);
  fdb_open(&dbfile,"dummy1",&fconfig);
  fdb_open(&dbfile_txn1,"dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
  uVar4 = 0;
  do {
    if (uVar4 == 4) {
      fdb_begin_transaction(dbfile_txn1,'\x02');
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        fdb_set(db_txn1,local_538[lVar3 + 2]);
      }
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        fdb_set(db,local_538[lVar3 + 4]);
      }
      fdb_end_transaction(dbfile_txn1,'\x01');
      fdb_close(dbfile);
      fdb_close(dbfile_txn1);
      fdb_open(&dbfile,"dummy1",&fconfig);
      fdb_open(&dbfile_txn1,"dummy1",&fconfig);
      fdb_kvs_open_default(dbfile,&db,&kvs_config);
      fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
      uVar4 = 0;
      while( true ) {
        if (uVar4 == 6) {
          for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
            fdb_set(db,local_538[lVar3 + 4]);
          }
          fdb_begin_transaction(dbfile_txn1,'\x02');
          for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
            fdb_set(db_txn1,local_538[lVar3 + 6]);
          }
          fdb_commit(dbfile,'\x01');
          fdb_open(&dbfile_txn2,"dummy1",&fconfig);
          fdb_kvs_open_default(dbfile_txn2,&db_txn2,&kvs_config);
          fdb_begin_transaction(dbfile_txn2,'\x02');
          for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
            fdb_set(db_txn2,local_538[lVar3 + 8]);
          }
          fdb_end_transaction(dbfile_txn2,'\x01');
          fdb_close(dbfile);
          fdb_close(dbfile_txn1);
          fdb_close(dbfile_txn2);
          fdb_open(&dbfile,"dummy1",&fconfig);
          fdb_kvs_open_default(dbfile,&db,&kvs_config);
          lVar3 = 0;
          do {
            if (lVar3 == 10) {
              fdb_open(&dbfile_txn1,"dummy1",&fconfig);
              fdb_open(&dbfile_txn2,"dummy1",&fconfig);
              fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
              fdb_kvs_open_default(dbfile_txn2,&db_txn2,&kvs_config);
              fdb_begin_transaction(dbfile_txn1,'\x02');
              fdb_set(db,local_538[10]);
              fdb_commit(dbfile,'\x01');
              fdb_set(db,local_538[0xb]);
              fdb_set(db_txn1,local_538[0xc]);
              fdb_commit(dbfile,'\x01');
              fdb_set(db_txn1,local_538[0xd]);
              fdb_begin_transaction(dbfile_txn2,'\x02');
              fdb_set(db_txn2,local_538[0xe]);
              fdb_end_transaction(dbfile_txn1,'\x01');
              fdb_set(db_txn2,local_538[0xf]);
              fdb_set(db,local_538[0x10]);
              fdb_end_transaction(dbfile_txn2,'\x01');
              fdb_set(db,local_538[0x11]);
              lVar3 = 0;
              fdb_commit(dbfile,'\0');
              fdb_close(dbfile);
              fdb_close(dbfile_txn1);
              fdb_close(dbfile_txn2);
              fdb_open(&dbfile,"dummy1",&fconfig);
              fdb_kvs_open_default(dbfile,&db,&kvs_config);
              while( true ) {
                if (lVar3 == 8) {
                  fdb_open(&dbfile_txn1,"dummy1",&fconfig);
                  fdb_kvs_open_default(dbfile_txn1,&db_txn1,&kvs_config);
                  fdb_begin_transaction(dbfile_txn1,'\x02');
                  fdb_set(db_txn1,local_538[0x14]);
                  fdb_compact(dbfile,"dummy2");
                  fdb_end_transaction(dbfile_txn1,'\x01');
                  fdb_close(dbfile);
                  fdb_close(dbfile_txn1);
                  for (lVar3 = 0; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
                    fdb_doc_free(local_538[lVar3]);
                  }
                  fdb_shutdown();
                  memleak_end();
                  __format = "%s PASSED\n";
                  if (last_wal_flush_header_test()::__test_pass != '\0') {
                    __format = "%s FAILED\n";
                  }
                  fprintf(_stderr,__format,"last wal flush header test");
                  return;
                }
                fdb_doc_create(&rdoc,local_538[lVar3 + 10]->key,local_538[lVar3 + 10]->keylen,
                               (void *)0x0,0,(void *)0x0,0);
                fVar2 = fdb_get(db,rdoc);
                if (fVar2 != FDB_RESULT_SUCCESS) break;
                fdb_doc_free(rdoc);
                rdoc = (fdb_doc *)0x0;
                lVar3 = lVar3 + 1;
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xfee);
              last_wal_flush_header_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xfee,"void last_wal_flush_header_test()");
            }
            fdb_doc_create(&rdoc,local_538[lVar3]->key,local_538[lVar3]->keylen,(void *)0x0,0,
                           (void *)0x0,0);
            fVar2 = fdb_get(db,rdoc);
            if ((int)lVar3 - 8U < 0xfffffffe) {
              if (fVar2 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0xfc3);
                last_wal_flush_header_test()::__test_pass = 1;
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0xfc3,"void last_wal_flush_header_test()");
              }
            }
            else if (fVar2 == FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xfc5);
              last_wal_flush_header_test()::__test_pass = 1;
              __assert_fail("status != FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0xfc5,"void last_wal_flush_header_test()");
            }
            fdb_doc_free(rdoc);
            rdoc = (fdb_doc *)0x0;
            lVar3 = lVar3 + 1;
          } while( true );
        }
        fdb_doc_create(&rdoc,local_538[uVar4]->key,local_538[uVar4]->keylen,(void *)0x0,0,
                       (void *)0x0,0);
        fVar2 = fdb_get(db,rdoc);
        if ((uVar4 < 4) && (fVar2 != FDB_RESULT_SUCCESS)) break;
        fdb_doc_free(rdoc);
        rdoc = (fdb_doc *)0x0;
        uVar4 = uVar4 + 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf9c);
      last_wal_flush_header_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf9c,"void last_wal_flush_header_test()");
    }
    fdb_doc_create(&rdoc,local_538[uVar4]->key,local_538[uVar4]->keylen,(void *)0x0,0,(void *)0x0,0)
    ;
    fVar2 = fdb_get(db,rdoc);
    if (uVar4 < 2) {
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xf7c);
        last_wal_flush_header_test()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf7c,"void last_wal_flush_header_test()");
      }
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf7e);
      last_wal_flush_header_test()::__test_pass = 1;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf7e,"void last_wal_flush_header_test()");
    }
    fdb_doc_free(rdoc);
    rdoc = (fdb_doc *)0x0;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void last_wal_flush_header_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2;
    fdb_kvs_handle *db, *db_txn1, *db_txn2;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // create docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
    }

    // insert docs without transaction
    for (i=0;i<2;++i) {
        fdb_set(db, doc[i]);
    }
    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // commit without transaction
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<4;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs using transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=2;i<4;++i){
        fdb_set(db_txn1, doc[i]);
    }
    // insert docs without transaction
    for (i=4;i<6;++i){
        fdb_set(db, doc[i]);
    }
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);

    // retrieve check
    for (i=0;i<6;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<4) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            // doesn't matter
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // insert docs without transaction
    for (i=4;i<6;++i) {
        fdb_set(db, doc[i]);
    }
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    for (i=6;i<8;++i) {
        fdb_set(db_txn1, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // begin another transaction
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    for (i=8;i<10;++i){
        fdb_set(db_txn2, doc[i]);
    }
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // close & reopen db
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=0;i<10;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<6 || i>=8) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_open(&dbfile_txn2, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);

    fdb_set(db, doc[10]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[11]);
    fdb_set(db_txn1, doc[12]);
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn1, doc[13]);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn2, doc[14]);
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db_txn2, doc[15]);
    fdb_set(db, doc[16]);
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_MANUAL_WAL_FLUSH);

    fdb_set(db, doc[17]);
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);
    fdb_open(&dbfile, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // retrieve check
    for (i=10;i<18;++i){
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    fdb_open(&dbfile_txn1, "dummy1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_set(db_txn1, doc[20]);

    fdb_compact(dbfile, "dummy2");

    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("last wal flush header test");
}